

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# init.cpp
# Opt level: O0

bool StartIndexBackgroundSync(NodeContext *node)

{
  bool bVar1;
  type pCVar2;
  AnnotatedMixin<std::recursive_mutex> *__s;
  CBlockIndex **ppCVar3;
  CBlockIndex *pCVar4;
  long in_FS_OFFSET;
  BaseIndex *index_1;
  vector<BaseIndex_*,_std::allocator<BaseIndex_*>_> *__range1_1;
  IndexSummary *summary;
  BaseIndex *index;
  vector<BaseIndex_*,_std::allocator<BaseIndex_*>_> *__range1;
  CChain *index_chain;
  Chainstate *chainstate;
  ChainstateManager *chainman;
  iterator __end1_1;
  iterator __begin1_1;
  CBlockIndex *start_block;
  CBlockIndex *pindex;
  iterator __end1;
  iterator __begin1;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock33;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock32;
  optional<const_CBlockIndex_*> indexes_start_block;
  string older_index_name;
  ChainstateManager *in_stack_fffffffffffffd68;
  undefined5 in_stack_fffffffffffffd70;
  undefined1 in_stack_fffffffffffffd75;
  undefined1 in_stack_fffffffffffffd76;
  undefined1 in_stack_fffffffffffffd77;
  CBlockIndex *in_stack_fffffffffffffd78;
  undefined7 in_stack_fffffffffffffd80;
  undefined1 in_stack_fffffffffffffd87;
  BlockManager *in_stack_fffffffffffffd88;
  BaseIndex *in_stack_fffffffffffffd90;
  char *in_stack_fffffffffffffd98;
  CBlockIndex *in_stack_fffffffffffffda0;
  allocator<char> *in_stack_fffffffffffffda8;
  int in_stack_fffffffffffffdb8;
  int in_stack_fffffffffffffdbc;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffdc0;
  CBlockIndex *in_stack_fffffffffffffdc8;
  int local_1ec;
  byte local_199;
  undefined1 local_181 [33];
  type local_160;
  uint32_t local_148 [2];
  uchar auStack_140 [24];
  uint32_t local_128 [2];
  uchar auStack_120 [208];
  byte local_50;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  std::optional<const_CBlockIndex_*>::optional
            ((optional<const_CBlockIndex_*> *)in_stack_fffffffffffffd68);
  std::__cxx11::string::string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffffd87,in_stack_fffffffffffffd80));
  inline_assertion_check<true,std::unique_ptr<ChainstateManager,std::default_delete<ChainstateManager>>&>
            ((unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_> *)
             in_stack_fffffffffffffda8,(char *)in_stack_fffffffffffffda0,
             (int)((ulong)in_stack_fffffffffffffd98 >> 0x20),(char *)in_stack_fffffffffffffd90,
             (char *)in_stack_fffffffffffffd88);
  pCVar2 = std::unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_>::operator*
                     ((unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_> *)
                      in_stack_fffffffffffffd78);
  MaybeCheckNotHeld<AnnotatedMixin<std::recursive_mutex>>
            ((AnnotatedMixin<std::recursive_mutex> *)in_stack_fffffffffffffd68);
  local_160 = pCVar2;
  StartIndexBackgroundSync::anon_class_8_1_3d09f077::operator()
            ((anon_class_8_1_3d09f077 *)in_stack_fffffffffffffd88);
  local_181._25_8_ =
       std::vector<BaseIndex_*,_std::allocator<BaseIndex_*>_>::begin
                 ((vector<BaseIndex_*,_std::allocator<BaseIndex_*>_> *)
                  CONCAT17(in_stack_fffffffffffffd77,
                           CONCAT16(in_stack_fffffffffffffd76,
                                    CONCAT15(in_stack_fffffffffffffd75,in_stack_fffffffffffffd70))))
  ;
  local_181._17_8_ =
       std::vector<BaseIndex_*,_std::allocator<BaseIndex_*>_>::end
                 ((vector<BaseIndex_*,_std::allocator<BaseIndex_*>_> *)
                  CONCAT17(in_stack_fffffffffffffd77,
                           CONCAT16(in_stack_fffffffffffffd76,
                                    CONCAT15(in_stack_fffffffffffffd75,in_stack_fffffffffffffd70))))
  ;
  while (bVar1 = __gnu_cxx::
                 operator==<BaseIndex_**,_std::vector<BaseIndex_*,_std::allocator<BaseIndex_*>_>_>
                           ((__normal_iterator<BaseIndex_**,_std::vector<BaseIndex_*,_std::allocator<BaseIndex_*>_>_>
                             *)in_stack_fffffffffffffd78,
                            (__normal_iterator<BaseIndex_**,_std::vector<BaseIndex_*,_std::allocator<BaseIndex_*>_>_>
                             *)CONCAT17(in_stack_fffffffffffffd77,
                                        CONCAT16(in_stack_fffffffffffffd76,
                                                 CONCAT15(in_stack_fffffffffffffd75,
                                                          in_stack_fffffffffffffd70)))),
        local_1ec = in_stack_fffffffffffffdb8, ((bVar1 ^ 0xffU) & 1) != 0) {
    __gnu_cxx::
    __normal_iterator<BaseIndex_**,_std::vector<BaseIndex_*,_std::allocator<BaseIndex_*>_>_>::
    operator*((__normal_iterator<BaseIndex_**,_std::vector<BaseIndex_*,_std::allocator<BaseIndex_*>_>_>
               *)in_stack_fffffffffffffd68);
    BaseIndex::GetSummary
              ((BaseIndex *)CONCAT44(in_stack_fffffffffffffdbc,in_stack_fffffffffffffdb8));
    if ((local_50 & 1) == 0) {
      MaybeCheckNotHeld<AnnotatedMixin<std::recursive_mutex>>
                ((AnnotatedMixin<std::recursive_mutex> *)in_stack_fffffffffffffd68);
      UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
                ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)in_stack_fffffffffffffda8,
                 (AnnotatedMixin<std::recursive_mutex> *)in_stack_fffffffffffffda0,
                 in_stack_fffffffffffffd98,(char *)in_stack_fffffffffffffd90,
                 (int)((ulong)in_stack_fffffffffffffd88 >> 0x20),
                 SUB81((ulong)in_stack_fffffffffffffd88 >> 0x18,0));
      local_181._9_8_ =
           ::node::BlockManager::LookupBlockIndex
                     (in_stack_fffffffffffffd88,
                      (uint256 *)CONCAT17(in_stack_fffffffffffffd87,in_stack_fffffffffffffd80));
      bVar1 = CChain::Contains((CChain *)in_stack_fffffffffffffd78,
                               (CBlockIndex *)
                               CONCAT17(in_stack_fffffffffffffd77,
                                        CONCAT16(in_stack_fffffffffffffd76,
                                                 CONCAT15(in_stack_fffffffffffffd75,
                                                          in_stack_fffffffffffffd70))));
      if (!bVar1) {
        in_stack_fffffffffffffdc8 =
             CChain::FindFork((CChain *)in_stack_fffffffffffffd90,
                              (CBlockIndex *)in_stack_fffffffffffffd88);
        local_181._9_8_ = in_stack_fffffffffffffdc8;
      }
      bVar1 = std::optional::operator_cast_to_bool
                        ((optional<const_CBlockIndex_*> *)in_stack_fffffffffffffd68);
      if ((bVar1) && ((CBlockIndex *)local_181._9_8_ != (CBlockIndex *)0x0)) {
        in_stack_fffffffffffffdbc = *(int *)(local_181._9_8_ + 0x18);
        in_stack_fffffffffffffdc0 =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             std::optional<const_CBlockIndex_*>::value
                       ((optional<const_CBlockIndex_*> *)in_stack_fffffffffffffd78);
        if (in_stack_fffffffffffffdbc <
            ((CBlockIndex *)(in_stack_fffffffffffffdc0->_M_dataplus)._M_p)->nHeight)
        goto LAB_001a2e36;
LAB_001a2e8c:
        local_1ec = 0;
      }
      else {
LAB_001a2e36:
        std::optional<const_CBlockIndex_*>::optional<const_CBlockIndex_*&,_true>
                  ((optional<const_CBlockIndex_*> *)in_stack_fffffffffffffd78,
                   (CBlockIndex **)
                   CONCAT17(in_stack_fffffffffffffd77,
                            CONCAT16(in_stack_fffffffffffffd76,
                                     CONCAT15(in_stack_fffffffffffffd75,in_stack_fffffffffffffd70)))
                  );
        local_128[0] = local_148[0];
        local_128[1] = local_148[1];
        auStack_120[0] = auStack_140[0];
        auStack_120[1] = auStack_140[1];
        auStack_120[2] = auStack_140[2];
        auStack_120[3] = auStack_140[3];
        auStack_120[4] = auStack_140[4];
        auStack_120[5] = auStack_140[5];
        auStack_120[6] = auStack_140[6];
        auStack_120[7] = auStack_140[7];
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffffd78,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT17(in_stack_fffffffffffffd77,
                            CONCAT16(in_stack_fffffffffffffd76,
                                     CONCAT15(in_stack_fffffffffffffd75,in_stack_fffffffffffffd70)))
                  );
        if ((CBlockIndex *)local_181._9_8_ != (CBlockIndex *)0x0) goto LAB_001a2e8c;
        local_1ec = 2;
      }
      UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::~UniqueLock
                ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)in_stack_fffffffffffffd68);
    }
    else {
      local_1ec = 3;
    }
    IndexSummary::~IndexSummary((IndexSummary *)in_stack_fffffffffffffd68);
    if ((local_1ec != 0) && (local_1ec == 2)) break;
    __gnu_cxx::
    __normal_iterator<BaseIndex_**,_std::vector<BaseIndex_*,_std::allocator<BaseIndex_*>_>_>::
    operator++((__normal_iterator<BaseIndex_**,_std::vector<BaseIndex_*,_std::allocator<BaseIndex_*>_>_>
                *)in_stack_fffffffffffffd68);
    in_stack_fffffffffffffdb8 = local_1ec;
  }
  bVar1 = std::optional::operator_cast_to_bool
                    ((optional<const_CBlockIndex_*> *)in_stack_fffffffffffffd68);
  if (bVar1) {
    __s = MaybeCheckNotHeld<AnnotatedMixin<std::recursive_mutex>>
                    ((AnnotatedMixin<std::recursive_mutex> *)in_stack_fffffffffffffd68);
    UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
              ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)in_stack_fffffffffffffda8,
               (AnnotatedMixin<std::recursive_mutex> *)in_stack_fffffffffffffda0,
               in_stack_fffffffffffffd98,(char *)in_stack_fffffffffffffd90,
               (int)((ulong)in_stack_fffffffffffffd88 >> 0x20),
               SUB81((ulong)in_stack_fffffffffffffd88 >> 0x18,0));
    ppCVar3 = std::optional<const_CBlockIndex_*>::operator*
                        ((optional<const_CBlockIndex_*> *)in_stack_fffffffffffffd68);
    local_181._1_8_ = *ppCVar3;
    if ((CBlockIndex *)local_181._1_8_ == (CBlockIndex *)0x0) {
      in_stack_fffffffffffffda8 =
           (allocator<char> *)ChainstateManager::ActiveChain(in_stack_fffffffffffffd68);
      in_stack_fffffffffffffda0 = CChain::Genesis((CChain *)in_stack_fffffffffffffd78);
      local_181._1_8_ = in_stack_fffffffffffffda0;
    }
    in_stack_fffffffffffffd90 = (BaseIndex *)&pCVar2->m_blockman;
    pCVar4 = CChain::Tip((CChain *)in_stack_fffffffffffffd78);
    inline_assertion_check<true,CBlockIndex_const*&>
              ((CBlockIndex **)in_stack_fffffffffffffda8,(char *)in_stack_fffffffffffffda0,
               (int)((ulong)pCVar4 >> 0x20),(char *)in_stack_fffffffffffffd90,
               (char *)in_stack_fffffffffffffd88);
    bVar1 = ::node::BlockManager::CheckBlockDataAvailability
                      ((BlockManager *)CONCAT17(in_stack_fffffffffffffd87,in_stack_fffffffffffffd80)
                       ,in_stack_fffffffffffffd78,
                       (CBlockIndex *)
                       CONCAT17(in_stack_fffffffffffffd77,
                                CONCAT16(in_stack_fffffffffffffd76,
                                         CONCAT15(in_stack_fffffffffffffd75,
                                                  in_stack_fffffffffffffd70))));
    if (!bVar1) {
      in_stack_fffffffffffffd78 = (CBlockIndex *)local_181;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffffdbc,local_1ec),(char *)__s,in_stack_fffffffffffffda8
                );
      Untranslated((string *)in_stack_fffffffffffffda0);
      tinyformat::format<std::__cxx11::string>
                ((bilingual_str *)in_stack_fffffffffffffdc8,in_stack_fffffffffffffdc0);
      local_199 = InitError((bilingual_str *)in_stack_fffffffffffffd90);
      in_stack_fffffffffffffd77 = local_199;
      bilingual_str::~bilingual_str((bilingual_str *)in_stack_fffffffffffffd68);
      bilingual_str::~bilingual_str((bilingual_str *)in_stack_fffffffffffffd68);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffd68);
      std::allocator<char>::~allocator((allocator<char> *)local_181);
    }
    UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::~UniqueLock
              ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)in_stack_fffffffffffffd68);
    if (!bVar1) goto LAB_001a32a6;
  }
  std::vector<BaseIndex_*,_std::allocator<BaseIndex_*>_>::begin
            ((vector<BaseIndex_*,_std::allocator<BaseIndex_*>_> *)
             CONCAT17(in_stack_fffffffffffffd77,
                      CONCAT16(in_stack_fffffffffffffd76,
                               CONCAT15(in_stack_fffffffffffffd75,in_stack_fffffffffffffd70))));
  std::vector<BaseIndex_*,_std::allocator<BaseIndex_*>_>::end
            ((vector<BaseIndex_*,_std::allocator<BaseIndex_*>_> *)
             CONCAT17(in_stack_fffffffffffffd77,
                      CONCAT16(in_stack_fffffffffffffd76,
                               CONCAT15(in_stack_fffffffffffffd75,in_stack_fffffffffffffd70))));
  while (bVar1 = __gnu_cxx::
                 operator==<BaseIndex_**,_std::vector<BaseIndex_*,_std::allocator<BaseIndex_*>_>_>
                           ((__normal_iterator<BaseIndex_**,_std::vector<BaseIndex_*,_std::allocator<BaseIndex_*>_>_>
                             *)in_stack_fffffffffffffd78,
                            (__normal_iterator<BaseIndex_**,_std::vector<BaseIndex_*,_std::allocator<BaseIndex_*>_>_>
                             *)CONCAT17(in_stack_fffffffffffffd77,
                                        CONCAT16(in_stack_fffffffffffffd76,
                                                 CONCAT15(in_stack_fffffffffffffd75,
                                                          in_stack_fffffffffffffd70)))),
        ((bVar1 ^ 0xffU) & 1) != 0) {
    __gnu_cxx::
    __normal_iterator<BaseIndex_**,_std::vector<BaseIndex_*,_std::allocator<BaseIndex_*>_>_>::
    operator*((__normal_iterator<BaseIndex_**,_std::vector<BaseIndex_*,_std::allocator<BaseIndex_*>_>_>
               *)in_stack_fffffffffffffd68);
    in_stack_fffffffffffffd76 = BaseIndex::StartBackgroundSync(in_stack_fffffffffffffd90);
    if (!(bool)in_stack_fffffffffffffd76) {
      local_199 = 0;
      goto LAB_001a32a6;
    }
    __gnu_cxx::
    __normal_iterator<BaseIndex_**,_std::vector<BaseIndex_*,_std::allocator<BaseIndex_*>_>_>::
    operator++((__normal_iterator<BaseIndex_**,_std::vector<BaseIndex_*,_std::allocator<BaseIndex_*>_>_>
                *)in_stack_fffffffffffffd68);
  }
  local_199 = 1;
LAB_001a32a6:
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffd68);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return (bool)(local_199 & 1);
}

Assistant:

bool StartIndexBackgroundSync(NodeContext& node)
{
    // Find the oldest block among all indexes.
    // This block is used to verify that we have the required blocks' data stored on disk,
    // starting from that point up to the current tip.
    // indexes_start_block='nullptr' means "start from height 0".
    std::optional<const CBlockIndex*> indexes_start_block;
    std::string older_index_name;
    ChainstateManager& chainman = *Assert(node.chainman);
    const Chainstate& chainstate = WITH_LOCK(::cs_main, return chainman.GetChainstateForIndexing());
    const CChain& index_chain = chainstate.m_chain;

    for (auto index : node.indexes) {
        const IndexSummary& summary = index->GetSummary();
        if (summary.synced) continue;

        // Get the last common block between the index best block and the active chain
        LOCK(::cs_main);
        const CBlockIndex* pindex = chainman.m_blockman.LookupBlockIndex(summary.best_block_hash);
        if (!index_chain.Contains(pindex)) {
            pindex = index_chain.FindFork(pindex);
        }

        if (!indexes_start_block || !pindex || pindex->nHeight < indexes_start_block.value()->nHeight) {
            indexes_start_block = pindex;
            older_index_name = summary.name;
            if (!pindex) break; // Starting from genesis so no need to look for earlier block.
        }
    };

    // Verify all blocks needed to sync to current tip are present.
    if (indexes_start_block) {
        LOCK(::cs_main);
        const CBlockIndex* start_block = *indexes_start_block;
        if (!start_block) start_block = chainman.ActiveChain().Genesis();
        if (!chainman.m_blockman.CheckBlockDataAvailability(*index_chain.Tip(), *Assert(start_block))) {
            return InitError(strprintf(Untranslated("%s best block of the index goes beyond pruned data. Please disable the index or reindex (which will download the whole blockchain again)"), older_index_name));
        }
    }

    // Start threads
    for (auto index : node.indexes) if (!index->StartBackgroundSync()) return false;
    return true;
}